

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_aws_sigv4.c
# Opt level: O3

CURLcode Curl_output_aws_sigv4(Curl_easy *data,_Bool proxy)

{
  curl_slist **ppcVar1;
  undefined1 *puVar2;
  connectdata *conn;
  bool bVar3;
  char cVar4;
  CURLcode CVar5;
  char *pcVar6;
  size_t sVar7;
  char *pcVar8;
  curl_slist *pcVar9;
  curl_slist *pcVar10;
  size_t sVar11;
  char *pcVar12;
  char *pcVar13;
  uchar *puVar14;
  uchar *data_00;
  uchar *data_01;
  uchar *key;
  size_t sVar15;
  curl_slist *list;
  curl_slist *pcVar16;
  char *pcVar17;
  int iVar18;
  curl_slist *pcVar19;
  ulong uVar20;
  char *pcVar21;
  curl_slist *l;
  byte *pbVar22;
  char timestamp [17];
  Curl_HttpReq httpreq;
  uchar sign0 [32];
  uchar sign1 [32];
  char service [65];
  char region [65];
  char provider0 [65];
  dynbuf signed_headers;
  char provider1 [65];
  char *method;
  dynbuf canonical_headers;
  time_t clock;
  char date_hdr_key [72];
  uchar sha_hash [32];
  tm tm;
  char sha_hex [65];
  CURLcode local_458;
  char *local_440;
  undefined8 local_418 [2];
  undefined1 local_408;
  Curl_HttpReq local_3fc;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined8 local_388;
  undefined8 uStack_380;
  undefined1 local_378;
  undefined8 local_368;
  undefined8 uStack_360;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined1 local_328;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined1 local_2d8;
  dynbuf local_2c8;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined1 local_268;
  char *local_258;
  dynbuf local_250;
  time_t local_230;
  undefined8 local_228;
  undefined1 local_220;
  byte local_1d8 [104];
  tm local_170;
  char local_138 [264];
  
  conn = data->conn;
  local_2d8 = 0;
  local_2e8 = 0;
  uStack_2e0 = 0;
  local_2f8 = 0;
  uStack_2f0 = 0;
  local_308 = 0;
  uStack_300 = 0;
  local_318 = 0;
  uStack_310 = 0;
  local_268 = 0;
  local_278 = 0;
  uStack_270 = 0;
  local_288 = 0;
  uStack_280 = 0;
  local_298 = 0;
  uStack_290 = 0;
  local_2a8 = 0;
  uStack_2a0 = 0;
  local_328 = 0;
  local_338 = 0;
  uStack_330 = 0;
  local_348 = 0;
  uStack_340 = 0;
  local_358 = 0;
  uStack_350 = 0;
  local_368 = 0;
  uStack_360 = 0;
  local_378 = 0;
  local_388 = 0;
  uStack_380 = 0;
  local_398 = 0;
  uStack_390 = 0;
  local_3a8 = 0;
  uStack_3a0 = 0;
  local_3b8 = 0;
  uStack_3b0 = 0;
  pcVar8 = (conn->host).name;
  puVar14 = (uchar *)(data->set).postfields;
  pcVar21 = (data->state).aptr.user;
  if (pcVar21 == (char *)0x0) {
    pcVar21 = "";
  }
  local_3e8 = 0;
  uStack_3e0 = 0;
  local_3f8 = 0;
  uStack_3f0 = 0;
  local_3c8 = 0;
  uStack_3c0 = 0;
  local_3d8 = 0;
  uStack_3d0 = 0;
  pcVar6 = Curl_checkheaders(data,"Authorization",0xd);
  if (pcVar6 != (char *)0x0) {
    return CURLE_OK;
  }
  Curl_dyn_init(&local_250,0x19000);
  Curl_dyn_init(&local_2c8,0x19000);
  pcVar6 = (data->set).str[0x4e];
  pcVar17 = "aws:amz";
  if (pcVar6 != (char *)0x0) {
    pcVar17 = pcVar6;
  }
  __isoc99_sscanf(pcVar17,"%64[^:]:%64[^:]:%64[^:]:%64s",&local_318,&local_2a8,&local_368,&local_3b8
                 );
  if ((char)local_318 == '\0') {
    local_440 = (char *)0x0;
    Curl_failf(data,"first provider can\'t be empty");
    local_458 = CURLE_BAD_FUNCTION_ARGUMENT;
    goto LAB_0060529b;
  }
  if ((char)local_2a8 == '\0') {
    strcpy((char *)&local_2a8,(char *)&local_318);
  }
  if ((uchar)local_3b8 != '\0') goto LAB_00604f94;
  pcVar6 = strchr(pcVar8,0x2e);
  if (pcVar6 == (char *)0x0) {
    pcVar8 = "service missing in parameters and hostname";
LAB_0060527a:
    local_440 = (char *)0x0;
    Curl_failf(data,pcVar8);
    local_458 = CURLE_URL_MALFORMAT;
LAB_0060529b:
    data_00 = (uchar *)0x0;
    puVar14 = (uchar *)0x0;
    pcVar8 = (char *)0x0;
  }
  else {
    uVar20 = (long)pcVar6 - (long)pcVar8;
    if (0x40 < uVar20) {
      pcVar8 = "service too long in hostname";
      goto LAB_0060527a;
    }
    strncpy((char *)&local_3b8,pcVar8,uVar20);
    *(undefined1 *)((long)&local_3b8 + uVar20) = 0;
    if ((uchar)local_368 == '\0') {
      pcVar6 = pcVar6 + 1;
      pcVar17 = strchr(pcVar6,0x2e);
      if (pcVar17 == (char *)0x0) {
        pcVar8 = "region missing in parameters and hostname";
      }
      else {
        uVar20 = (long)pcVar17 - (long)pcVar6;
        if (uVar20 < 0x41) {
          strncpy((char *)&local_368,pcVar6,uVar20);
          *(undefined1 *)((long)&local_368 + uVar20) = 0;
          goto LAB_00604f94;
        }
        pcVar8 = "region too long in hostname";
      }
      goto LAB_0060527a;
    }
LAB_00604f94:
    time(&local_230);
    local_458 = Curl_gmtime(local_230,&local_170);
    if (local_458 != CURLE_OK) {
LAB_00604fbd:
      local_440 = (char *)0x0;
      goto LAB_0060529b;
    }
    sVar7 = strftime((char *)local_418,0x11,"%Y%m%dT%H%M%SZ",(tm *)&local_170);
    if (sVar7 == 0) {
      local_458 = CURLE_OUT_OF_MEMORY;
      goto LAB_00604fbd;
    }
    sVar7 = strlen((char *)&local_2a8);
    Curl_strntolower((char *)&local_2a8,(char *)&local_2a8,sVar7);
    cVar4 = Curl_raw_toupper((char)local_2a8);
    local_2a8 = CONCAT71(local_2a8._1_7_,cVar4);
    curl_msnprintf((char *)&local_228,0x48,"X-%s-Date",&local_2a8);
    Curl_strntolower((char *)&local_2a8,(char *)&local_2a8,1);
    curl_msnprintf((char *)local_1d8,0x5a,"x-%s-date:%s",&local_2a8,local_418);
    pcVar6 = Curl_checkheaders(data,"Host",4);
    if (pcVar6 == (char *)0x0) {
      pcVar6 = (data->state).aptr.host;
      if (pcVar6 == (char *)0x0) {
        sVar7 = strlen(pcVar8);
        local_458 = CURLE_URL_MALFORMAT;
        if (sVar7 < 0x100) {
          curl_msnprintf(local_138,0x105,"host:%s",pcVar8);
          goto LAB_00605407;
        }
      }
      else {
        sVar7 = strlen(pcVar6);
        local_458 = CURLE_URL_MALFORMAT;
        if (sVar7 < 0x106) {
          strcpy(local_138,pcVar6);
          sVar7 = strcspn(local_138,"\n\r");
          local_138[sVar7] = '\0';
LAB_00605407:
          list = curl_slist_append((curl_slist *)0x0,local_138);
          if (list != (curl_slist *)0x0) {
            for (pcVar9 = (data->set).headers; pcVar16 = list, pcVar9 != (curl_slist *)0x0;
                pcVar9 = pcVar9->next) {
LAB_00605108:
              list = curl_slist_append(pcVar16,pcVar9->data);
              if (list == (curl_slist *)0x0) {
                local_440 = (char *)0x0;
                goto LAB_006053c1;
              }
            }
            do {
              pcVar8 = pcVar16->data;
              sVar7 = strcspn(pcVar8,":");
              Curl_strntolower(pcVar8,pcVar8,sVar7);
              if (pcVar16->data[sVar7] != '\0') {
                pcVar8 = pcVar16->data + sVar7 + 1;
                for (pcVar6 = pcVar8; (cVar4 = *pcVar6, cVar4 == '\t' || (cVar4 == ' '));
                    pcVar6 = pcVar6 + 1) {
                }
                while (cVar4 != '\0') {
                  iVar18 = 0;
                  pcVar17 = pcVar6;
                  while ((pcVar6 = pcVar17 + 1, cVar4 == ' ' || (cVar4 == '\t'))) {
                    iVar18 = iVar18 + -1;
                    pcVar17 = pcVar6;
                    cVar4 = *pcVar6;
                  }
                  if (iVar18 != 0) {
                    if (cVar4 == '\0') break;
                    cVar4 = ' ';
                    pcVar6 = pcVar17;
                  }
                  *pcVar8 = cVar4;
                  pcVar8 = pcVar8 + 1;
                  cVar4 = *pcVar6;
                }
                *pcVar8 = '\0';
              }
              ppcVar1 = &pcVar16->next;
              pcVar16 = *ppcVar1;
            } while (*ppcVar1 != (curl_slist *)0x0);
            goto LAB_006051c3;
          }
          local_458 = CURLE_OUT_OF_MEMORY;
        }
      }
      local_440 = (char *)0x0;
      list = (curl_slist *)0x0;
LAB_006055b1:
      curl_slist_free_all(list);
      puVar14 = (uchar *)0x0;
      data_00 = (uchar *)0x0;
      pcVar8 = (char *)0x0;
      data_01 = (uchar *)0x0;
      key = (uchar *)0x0;
      goto LAB_006052a3;
    }
    pcVar9 = (data->set).headers;
    pcVar16 = (curl_slist *)0x0;
    list = (curl_slist *)0x0;
    if (pcVar9 != (curl_slist *)0x0) goto LAB_00605108;
LAB_006051c3:
    sVar7 = strlen((char *)&local_228);
    pcVar8 = Curl_checkheaders(data,(char *)&local_228,sVar7);
    if ((pcVar8 != (char *)0x0) ||
       (pcVar8 = Curl_checkheaders(data,"Date",4), pcVar8 != (char *)0x0)) {
      local_440 = (*Curl_cstrdup)(pcVar8);
      if (local_440 == (char *)0x0) goto LAB_0060559b;
      pcVar8 = strchr(local_440,0x3a);
      pcVar16 = list;
      if (pcVar8 != (char *)0x0) {
        do {
          do {
            pcVar8 = pcVar8 + 1;
          } while (*pcVar8 == ' ');
        } while (*pcVar8 == '\t');
        strncpy((char *)local_418,pcVar8,0x10);
        local_408 = 0;
        if (list != (curl_slist *)0x0) goto LAB_006054a8;
        list = (curl_slist *)0x0;
        goto LAB_006055d7;
      }
LAB_006053c1:
      local_458 = CURLE_OUT_OF_MEMORY;
      list = pcVar16;
      goto LAB_006055b1;
    }
    pcVar9 = curl_slist_append(list,(char *)local_1d8);
    if (pcVar9 == (curl_slist *)0x0) {
LAB_0060559b:
      local_458 = CURLE_OUT_OF_MEMORY;
      local_440 = (char *)0x0;
      goto LAB_006055b1;
    }
    local_440 = curl_maprintf("%s: %s",&local_228,local_418);
    list = pcVar9;
LAB_006054a8:
    pcVar9 = list->next;
    do {
      if (pcVar9 == (curl_slist *)0x0) break;
      bVar3 = false;
      pcVar16 = pcVar9;
      pcVar19 = list;
      pcVar8 = list->data;
      do {
        pcVar10 = pcVar16;
        pcVar6 = pcVar10->data;
        iVar18 = strcmp(pcVar8,pcVar6);
        if (0 < iVar18) {
          pcVar19->data = pcVar6;
          pcVar10->data = pcVar8;
          bVar3 = true;
          pcVar6 = pcVar8;
        }
        pcVar16 = pcVar10->next;
        pcVar19 = pcVar10;
        pcVar8 = pcVar6;
      } while (pcVar10->next != (curl_slist *)0x0);
    } while (bVar3);
    pcVar9 = list;
    do {
      CVar5 = Curl_dyn_add(&local_250,pcVar9->data);
      pcVar16 = list;
      if ((CVar5 != CURLE_OK) || (CVar5 = Curl_dyn_add(&local_250,"\n"), CVar5 != CURLE_OK))
      goto LAB_006053c1;
      pcVar8 = strchr(pcVar9->data,0x3a);
      if (pcVar8 != (char *)0x0) {
        *pcVar8 = '\0';
      }
      if (((pcVar9 != list) && (CVar5 = Curl_dyn_add(&local_2c8,";"), CVar5 != CURLE_OK)) ||
         (CVar5 = Curl_dyn_add(&local_2c8,pcVar9->data), CVar5 != CURLE_OK)) goto LAB_006053c1;
      pcVar9 = pcVar9->next;
    } while (pcVar9 != (curl_slist *)0x0);
LAB_006055d7:
    curl_slist_free_all(list);
    local_228 = local_418[0];
    local_220 = 0;
    if (puVar14 == (uchar *)0x0) {
      sVar11 = 0;
    }
    else {
      sVar11 = (data->set).postfieldsize;
      if ((long)sVar11 < 0) {
        sVar11 = strlen((char *)puVar14);
      }
    }
    pbVar22 = local_1d8;
    CVar5 = Curl_sha256it(pbVar22,puVar14,sVar11);
    if (CVar5 != CURLE_OK) {
      local_458 = CURLE_OUT_OF_MEMORY;
      goto LAB_0060529b;
    }
    sVar11 = 0x41;
    pcVar8 = local_138;
    do {
      curl_msnprintf(pcVar8,sVar11,"%02x",(ulong)*pbVar22);
      sVar11 = sVar11 - 2;
      pbVar22 = pbVar22 + 1;
      pcVar8 = pcVar8 + 2;
    } while (sVar11 != 1);
    Curl_http_method(data,conn,&local_258,&local_3fc);
    pcVar8 = (data->state).up.path;
    pcVar6 = (data->state).up.query;
    if (pcVar6 == (char *)0x0) {
      pcVar6 = "";
    }
    pcVar12 = Curl_dyn_ptr(&local_250);
    pcVar13 = Curl_dyn_ptr(&local_2c8);
    pcVar17 = local_138;
    puVar14 = (uchar *)curl_maprintf("%s\n%s\n%s\n%s\n%s\n%s",local_258,pcVar8,pcVar6,pcVar12,
                                     pcVar13,pcVar17);
    if (puVar14 == (uchar *)0x0) {
      local_458 = CURLE_OUT_OF_MEMORY;
      goto LAB_0060529b;
    }
    sVar7 = strlen((char *)&local_318);
    Curl_strntolower((char *)&local_318,(char *)&local_318,sVar7);
    data_00 = (uchar *)curl_maprintf("%s4_request",&local_318);
    if (data_00 == (uchar *)0x0) {
      local_458 = CURLE_OUT_OF_MEMORY;
      data_00 = (uchar *)0x0;
      data_01 = (uchar *)0x0;
      key = (uchar *)0x0;
      pcVar8 = (char *)0x0;
      goto LAB_006052a3;
    }
    pcVar8 = curl_maprintf("%s/%s/%s/%s",&local_228,&local_368,&local_3b8,data_00);
    if (pcVar8 == (char *)0x0) {
      pcVar8 = (char *)0x0;
LAB_00605806:
      local_458 = CURLE_OUT_OF_MEMORY;
      key = (uchar *)0x0;
      data_01 = (uchar *)0x0;
      goto LAB_006052a3;
    }
    sVar7 = strlen((char *)puVar14);
    pbVar22 = local_1d8;
    CVar5 = Curl_sha256it(pbVar22,puVar14,sVar7);
    if (CVar5 != CURLE_OK) goto LAB_00605806;
    sVar11 = 0x41;
    do {
      curl_msnprintf(pcVar17,sVar11,"%02x",(ulong)*pbVar22);
      sVar11 = sVar11 - 2;
      pbVar22 = pbVar22 + 1;
      pcVar17 = pcVar17 + 2;
    } while (sVar11 != 1);
    local_458 = CURLE_OUT_OF_MEMORY;
    sVar7 = strlen((char *)&local_318);
    Curl_strntoupper((char *)&local_318,(char *)&local_318,sVar7);
    pcVar6 = local_138;
    data_01 = (uchar *)curl_maprintf("%s4-HMAC-SHA256\n%s\n%s\n%s",&local_318,local_418,pcVar8,
                                     pcVar6);
    if (data_01 != (uchar *)0x0) {
      pcVar17 = (data->state).aptr.passwd;
      pcVar12 = "";
      if (pcVar17 != (char *)0x0) {
        pcVar12 = pcVar17;
      }
      key = (uchar *)curl_maprintf("%s4%s",&local_318,pcVar12);
      if (key == (uchar *)0x0) {
        key = (uchar *)0x0;
      }
      else {
        sVar7 = strlen((char *)key);
        sVar15 = strlen((char *)&local_228);
        local_458 = Curl_hmacit(Curl_HMAC_SHA256,key,sVar7 & 0xffffffff,(uchar *)&local_228,
                                sVar15 & 0xffffffff,(uchar *)&local_3f8);
        if (local_458 == CURLE_OK) {
          sVar7 = strlen((char *)&local_368);
          local_458 = Curl_hmacit(Curl_HMAC_SHA256,(uchar *)&local_3f8,0x20,(uchar *)&local_368,
                                  sVar7 & 0xffffffff,(uchar *)&local_3d8);
          if (local_458 == CURLE_OK) {
            sVar7 = strlen((char *)&local_3b8);
            local_458 = Curl_hmacit(Curl_HMAC_SHA256,(uchar *)&local_3d8,0x20,(uchar *)&local_3b8,
                                    sVar7 & 0xffffffff,(uchar *)&local_3f8);
            if (local_458 == CURLE_OK) {
              sVar7 = strlen((char *)data_00);
              local_458 = Curl_hmacit(Curl_HMAC_SHA256,(uchar *)&local_3f8,0x20,data_00,
                                      sVar7 & 0xffffffff,(uchar *)&local_3d8);
              if (local_458 == CURLE_OK) {
                sVar7 = strlen((char *)data_01);
                pbVar22 = (byte *)&local_3f8;
                local_458 = Curl_hmacit(Curl_HMAC_SHA256,(uchar *)&local_3d8,0x20,data_01,
                                        sVar7 & 0xffffffff,pbVar22);
                if (local_458 == CURLE_OK) {
                  sVar11 = 0x41;
                  do {
                    curl_msnprintf(pcVar6,sVar11,"%02x",(ulong)*pbVar22);
                    sVar11 = sVar11 - 2;
                    pbVar22 = pbVar22 + 1;
                    pcVar6 = pcVar6 + 2;
                  } while (sVar11 != 1);
                  pcVar6 = Curl_dyn_ptr(&local_2c8);
                  local_458 = CURLE_OK;
                  pcVar21 = curl_maprintf("Authorization: %s4-HMAC-SHA256 Credential=%s/%s, SignedHeaders=%s, Signature=%s\r\n%s\r\n"
                                          ,&local_318,pcVar21,pcVar8,pcVar6,local_138,local_440);
                  if (pcVar21 != (char *)0x0) {
                    (*Curl_cfree)((data->state).aptr.userpwd);
                    (data->state).aptr.userpwd = pcVar21;
                    puVar2 = &(data->state).authhost.field_0x18;
                    *puVar2 = *puVar2 | 1;
                  }
                }
              }
            }
          }
        }
      }
      goto LAB_006052a3;
    }
  }
  data_01 = (uchar *)0x0;
  key = (uchar *)0x0;
LAB_006052a3:
  Curl_dyn_free(&local_250);
  Curl_dyn_free(&local_2c8);
  (*Curl_cfree)(puVar14);
  (*Curl_cfree)(data_00);
  (*Curl_cfree)(pcVar8);
  (*Curl_cfree)(data_01);
  (*Curl_cfree)(key);
  (*Curl_cfree)(local_440);
  return local_458;
}

Assistant:

CURLcode Curl_output_aws_sigv4(struct Curl_easy *data, bool proxy)
{
  CURLcode ret = CURLE_OUT_OF_MEMORY;
  struct connectdata *conn = data->conn;
  size_t len;
  const char *arg;
  char provider0[MAX_SIGV4_LEN + 1]="";
  char provider1[MAX_SIGV4_LEN + 1]="";
  char region[MAX_SIGV4_LEN + 1]="";
  char service[MAX_SIGV4_LEN + 1]="";
  const char *hostname = conn->host.name;
  time_t clock;
  struct tm tm;
  char timestamp[TIMESTAMP_SIZE];
  char date[9];
  struct dynbuf canonical_headers;
  struct dynbuf signed_headers;
  char *date_header = NULL;
  const char *post_data = data->set.postfields;
  size_t post_data_len = 0;
  unsigned char sha_hash[32];
  char sha_hex[65];
  char *canonical_request = NULL;
  char *request_type = NULL;
  char *credential_scope = NULL;
  char *str_to_sign = NULL;
  const char *user = data->state.aptr.user ? data->state.aptr.user : "";
  char *secret = NULL;
  unsigned char sign0[32] = {0};
  unsigned char sign1[32] = {0};
  char *auth_headers = NULL;

  DEBUGASSERT(!proxy);
  (void)proxy;

  if(Curl_checkheaders(data, STRCONST("Authorization"))) {
    /* Authorization already present, Bailing out */
    return CURLE_OK;
  }

  /* we init thoses buffers here, so goto fail will free initialized dynbuf */
  Curl_dyn_init(&canonical_headers, CURL_MAX_HTTP_HEADER);
  Curl_dyn_init(&signed_headers, CURL_MAX_HTTP_HEADER);

  /*
   * Parameters parsing
   * Google and Outscale use the same OSC or GOOG,
   * but Amazon uses AWS and AMZ for header arguments.
   * AWS is the default because most of non-amazon providers
   * are still using aws:amz as a prefix.
   */
  arg = data->set.str[STRING_AWS_SIGV4] ?
    data->set.str[STRING_AWS_SIGV4] : "aws:amz";

  /* provider1[:provider2[:region[:service]]]

     No string can be longer than N bytes of non-whitespace
   */
  (void)sscanf(arg, "%" MAX_SIGV4_LEN_TXT "[^:]"
               ":%" MAX_SIGV4_LEN_TXT "[^:]"
               ":%" MAX_SIGV4_LEN_TXT "[^:]"
               ":%" MAX_SIGV4_LEN_TXT "s",
               provider0, provider1, region, service);
  if(!provider0[0]) {
    failf(data, "first provider can't be empty");
    ret = CURLE_BAD_FUNCTION_ARGUMENT;
    goto fail;
  }
  else if(!provider1[0])
    strcpy(provider1, provider0);

  if(!service[0]) {
    char *hostdot = strchr(hostname, '.');
    if(!hostdot) {
      failf(data, "service missing in parameters and hostname");
      ret = CURLE_URL_MALFORMAT;
      goto fail;
    }
    len = hostdot - hostname;
    if(len > MAX_SIGV4_LEN) {
      failf(data, "service too long in hostname");
      ret = CURLE_URL_MALFORMAT;
      goto fail;
    }
    strncpy(service, hostname, len);
    service[len] = '\0';

    if(!region[0]) {
      const char *reg = hostdot + 1;
      const char *hostreg = strchr(reg, '.');
      if(!hostreg) {
        failf(data, "region missing in parameters and hostname");
        ret = CURLE_URL_MALFORMAT;
        goto fail;
      }
      len = hostreg - reg;
      if(len > MAX_SIGV4_LEN) {
        failf(data, "region too long in hostname");
        ret = CURLE_URL_MALFORMAT;
        goto fail;
      }
      strncpy(region, reg, len);
      region[len] = '\0';
    }
  }

#ifdef DEBUGBUILD
  {
    char *force_timestamp = getenv("CURL_FORCETIME");
    if(force_timestamp)
      clock = 0;
    else
      time(&clock);
  }
#else
  time(&clock);
#endif
  ret = Curl_gmtime(clock, &tm);
  if(ret) {
    goto fail;
  }
  if(!strftime(timestamp, sizeof(timestamp), "%Y%m%dT%H%M%SZ", &tm)) {
    ret = CURLE_OUT_OF_MEMORY;
    goto fail;
  }

  ret = make_headers(data, hostname, timestamp, provider1,
                     &date_header, &canonical_headers, &signed_headers);
  if(ret)
    goto fail;
  ret = CURLE_OUT_OF_MEMORY;

  memcpy(date, timestamp, sizeof(date));
  date[sizeof(date) - 1] = 0;

  if(post_data) {
    if(data->set.postfieldsize < 0)
      post_data_len = strlen(post_data);
    else
      post_data_len = (size_t)data->set.postfieldsize;
  }
  if(Curl_sha256it(sha_hash, (const unsigned char *) post_data,
                   post_data_len))
    goto fail;

  sha256_to_hex(sha_hex, sha_hash, sizeof(sha_hex));

  {
    Curl_HttpReq httpreq;
    const char *method;

    Curl_http_method(data, conn, &method, &httpreq);

    canonical_request =
      curl_maprintf("%s\n" /* HTTPRequestMethod */
                    "%s\n" /* CanonicalURI */
                    "%s\n" /* CanonicalQueryString */
                    "%s\n" /* CanonicalHeaders */
                    "%s\n" /* SignedHeaders */
                    "%s",  /* HashedRequestPayload in hex */
                    method,
                    data->state.up.path,
                    data->state.up.query ? data->state.up.query : "",
                    Curl_dyn_ptr(&canonical_headers),
                    Curl_dyn_ptr(&signed_headers),
                    sha_hex);
    if(!canonical_request)
      goto fail;
  }

  /* provider 0 lowercase */
  Curl_strntolower(provider0, provider0, strlen(provider0));
  request_type = curl_maprintf("%s4_request", provider0);
  if(!request_type)
    goto fail;

  credential_scope = curl_maprintf("%s/%s/%s/%s",
                                   date, region, service, request_type);
  if(!credential_scope)
    goto fail;

  if(Curl_sha256it(sha_hash, (unsigned char *) canonical_request,
                   strlen(canonical_request)))
    goto fail;

  sha256_to_hex(sha_hex, sha_hash, sizeof(sha_hex));

  /* provider 0 uppercase */
  Curl_strntoupper(provider0, provider0, strlen(provider0));

  /*
   * Google allows using RSA key instead of HMAC, so this code might change
   * in the future. For now we ony support HMAC.
   */
  str_to_sign = curl_maprintf("%s4-HMAC-SHA256\n" /* Algorithm */
                              "%s\n" /* RequestDateTime */
                              "%s\n" /* CredentialScope */
                              "%s",  /* HashedCanonicalRequest in hex */
                              provider0,
                              timestamp,
                              credential_scope,
                              sha_hex);
  if(!str_to_sign) {
    goto fail;
  }

  /* provider 0 uppercase */
  secret = curl_maprintf("%s4%s", provider0,
                         data->state.aptr.passwd ?
                         data->state.aptr.passwd : "");
  if(!secret)
    goto fail;

  HMAC_SHA256(secret, strlen(secret), date, strlen(date), sign0);
  HMAC_SHA256(sign0, sizeof(sign0), region, strlen(region), sign1);
  HMAC_SHA256(sign1, sizeof(sign1), service, strlen(service), sign0);
  HMAC_SHA256(sign0, sizeof(sign0), request_type, strlen(request_type), sign1);
  HMAC_SHA256(sign1, sizeof(sign1), str_to_sign, strlen(str_to_sign), sign0);

  sha256_to_hex(sha_hex, sign0, sizeof(sha_hex));

  /* provider 0 uppercase */
  auth_headers = curl_maprintf("Authorization: %s4-HMAC-SHA256 "
                               "Credential=%s/%s, "
                               "SignedHeaders=%s, "
                               "Signature=%s\r\n"
                               "%s\r\n",
                               provider0,
                               user,
                               credential_scope,
                               Curl_dyn_ptr(&signed_headers),
                               sha_hex,
                               date_header);
  if(!auth_headers) {
    goto fail;
  }

  Curl_safefree(data->state.aptr.userpwd);
  data->state.aptr.userpwd = auth_headers;
  data->state.authhost.done = TRUE;
  ret = CURLE_OK;

fail:
  Curl_dyn_free(&canonical_headers);
  Curl_dyn_free(&signed_headers);
  free(canonical_request);
  free(request_type);
  free(credential_scope);
  free(str_to_sign);
  free(secret);
  free(date_header);
  return ret;
}